

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaMethodBuilder::setReturnType(QMetaMethodBuilder *this,QByteArray *value)

{
  long lVar1;
  QMetaMethodBuilderPrivate *other;
  QByteArray *in_RSI;
  QMetaMethodBuilder *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilderPrivate *d;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = d_func(in_RDI);
  if (other != (QMetaMethodBuilderPrivate *)0x0) {
    QByteArray::operator_cast_to_char_((QByteArray *)0x3721df);
    QMetaObject::normalizedType(in_stack_ffffffffffffffe8);
    QByteArray::operator=(in_RSI,&other->signature);
    QByteArray::~QByteArray((QByteArray *)0x372208);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaMethodBuilder::setReturnType(const QByteArray &value)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        d->returnType = QMetaObject::normalizedType(value);
}